

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int indexColumnNotNull(Index *pIdx,int iCol)

{
  short sVar1;
  
  sVar1 = pIdx->aiColumn[iCol];
  if (-1 < (long)sVar1) {
    return (int)pIdx->pTable->aCol[sVar1].notNull;
  }
  return (int)(sVar1 == -1);
}

Assistant:

static int indexColumnNotNull(Index *pIdx, int iCol){
  int j;
  assert( pIdx!=0 );
  assert( iCol>=0 && iCol<pIdx->nColumn );
  j = pIdx->aiColumn[iCol];
  if( j>=0 ){
    return pIdx->pTable->aCol[j].notNull;
  }else if( j==(-1) ){
    return 1;
  }else{
    assert( j==(-2) );
    return 0;  /* Assume an indexed expression can always yield a NULL */

  }
}